

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

bool __thiscall libcellml::XmlNode::hasNamespaceDefinition(XmlNode *this,string *uri)

{
  bool bVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  xmlNs *next;
  xmlNs *pxVar5;
  string href;
  allocator<char> local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pxVar5 = this->mPimpl->mXmlNodePtr->nsDef;
  if (pxVar5 == (xmlNs *)0x0) {
    bVar4 = false;
  }
  else {
    do {
      bVar4 = pxVar5 != (xmlNs *)0x0;
      if (pxVar5 == (xmlNs *)0x0) {
        return bVar4;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)pxVar5->href,&local_51);
      plVar2 = local_50;
      if ((local_48 != uri->_M_string_length) ||
         ((bVar1 = true, local_48 != 0 &&
          (iVar3 = bcmp(local_50,(uri->_M_dataplus)._M_p,local_48), iVar3 != 0)))) {
        pxVar5 = pxVar5->next;
        bVar1 = false;
      }
      if (plVar2 != local_40) {
        operator_delete(plVar2,local_40[0] + 1);
      }
    } while (!bVar1);
  }
  return bVar4;
}

Assistant:

bool XmlNode::hasNamespaceDefinition(const std::string &uri)
{
    if (mPimpl->mXmlNodePtr->nsDef != nullptr) {
        auto next = mPimpl->mXmlNodePtr->nsDef;
        while (next != nullptr) {
            // If you have a namespace, the href cannot be empty.
            std::string href = std::string(reinterpret_cast<const char *>(next->href));
            if (href == uri) {
                return true;
            }
            next = next->next;
        }
    }
    return false;
}